

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O3

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::validate_data_invariants
          (flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
           *this)

{
  ushort *puVar1;
  ushort *puVar2;
  bool bVar3;
  header_type_const_ptr unaligned_e;
  ushort *puVar4;
  ulong uVar5;
  ulong uVar6;
  buffer_t<char> local_38;
  
  puVar4 = (ushort *)(this->buffer_).v2_.last;
  if (puVar4 != (ushort *)0x0) {
    puVar2 = (ushort *)(this->buffer_).v2_.begin;
    puVar4 = (ushort *)((long)puVar4 + (ulong)*puVar4 + 2);
    if (puVar2 == (ushort *)0x0) {
      if (puVar4 != (ushort *)0x0) goto LAB_0010e8e1;
      local_38.begin = (pointer_type)0x0;
      local_38.last = (pointer_type)0x0;
      local_38.end = (pointer_type)0x0;
      buffer_t<char>::validate(&local_38);
    }
    else if (puVar2 == puVar4) {
      local_38.last = (pointer_type)0x0;
      local_38.begin = (pointer_type)puVar2;
      local_38.end = (pointer_type)puVar2;
      buffer_t<char>::validate(&local_38);
    }
    else {
      uVar5 = (long)puVar4 - (long)puVar2;
      if (puVar4 < puVar2) goto LAB_0010e8e1;
      bVar3 = true;
      if ((long)uVar5 < 2) {
        local_38.last = (pointer_type)0x0;
      }
      else {
        uVar6 = (ulong)*puVar2 + 2;
        puVar1 = puVar2;
        if (uVar5 < uVar6) {
          local_38.last = (pointer_type)0x0;
        }
        else {
          do {
            local_38.last = (pointer_type)puVar1;
            uVar5 = uVar5 - uVar6;
            if ((long)uVar5 < 2) goto LAB_0010e877;
            puVar1 = (ushort *)((long)local_38.last + uVar6);
            uVar6 = (ulong)*(ushort *)((long)local_38.last + uVar6) + 2;
          } while (uVar6 <= uVar5);
        }
        bVar3 = false;
      }
LAB_0010e877:
      local_38.begin = (pointer_type)puVar2;
      local_38.end = (pointer_type)puVar4;
      buffer_t<char>::validate(&local_38);
      if (!bVar3) goto LAB_0010e8e1;
    }
    flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>::
    last((flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
          *)&local_38);
    if (local_38.begin != (this->buffer_).v2_.last) {
LAB_0010e8e1:
      std::terminate();
    }
  }
  return;
}

Assistant:

void validate_data_invariants() const noexcept {
#ifdef FFL_DBG_CHECK_DATA_VALID
        if (buff().last) {
            size_with_padding_t const last_element_size = traits_traits::get_size(buff().last);
            //
            // For element types that have offset of next element use entire buffer for validation
            // for element types that do not have offset to the next element, we have to limit 
            // by the end of the last element.
            // If there is sufficient reservation after last element then validate would not know 
            // where to stop, and might fail.
            //
            size_type buffer_length{ 0 };
            if constexpr (traits_traits::has_next_offset_v) {
                buffer_length = static_cast<size_type>(buff().end - buff().begin);
            } else {
                buffer_length = static_cast<size_type>(buff().last - buff().begin) + last_element_size.size;
            }

            size_type const last_element_offset{ static_cast<size_type>(buff().last - buff().begin) };
            FFL_CODDING_ERROR_IF(buffer_length < (last_element_offset + last_element_size.size));

            auto const [valid, buffer_view] = flat_forward_list_validate<T, TT>(buff().begin, buff().begin + buffer_length);
            FFL_CODDING_ERROR_IF_NOT(valid);
            FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
        }
#endif //FFL_DBG_CHECK_DATA_VALID
    }